

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_vector::test_method(value_vector *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  Scalar *pSVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d8;
  basic_cstring<const_char> local_4b8;
  assertion_result local_4a8;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  output_test_stream local_460 [8];
  output_test_stream output_1;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2c0;
  basic_cstring<const_char> local_2a0;
  assertion_result local_290;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  output_test_stream local_248 [8];
  output_test_stream output;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a8;
  assertion_result local_88;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60;
  Value local_50 [8];
  Value value;
  Value local_40 [8];
  Value value1;
  undefined1 local_20 [8];
  Vector avector1;
  value_vector *this_local;
  
  avector1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_20,2);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_20,0);
  *pSVar4 = 0.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_20,1);
  *pSVar4 = 1.5;
  dynamicgraph::command::Value::Value(local_40,(Matrix *)local_20);
  dynamicgraph::command::Value::Value(local_50,local_40);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x114,&local_70);
    bVar2 = dynamicgraph::command::Value::operator==(local_40,local_50);
    boost::test_tools::assertion_result::assertion_result(&local_88,(bool)(bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,"value1 == value",0xf);
    boost::unit_test::operator<<(&local_a8,plVar5,&local_b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_88,&local_a8,&local_c8,0x114,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a8);
    boost::test_tools::assertion_result::~assertion_result(&local_88);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_258);
  boost::test_tools::output_test_stream::output_test_stream(local_248,&local_258,1);
  dynamicgraph::command::operator<<((ostream *)local_248,local_40);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_278);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x119,&local_278);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_2a0,"Type=vector, value=0.5\n1.5");
    boost::test_tools::output_test_stream::is_equal(&local_290,local_248,&local_2a0,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,"output.is_equal(\"Type=vector, value=0.5\\n1.5\")",0x2e);
    boost::unit_test::operator<<(&local_2c0,plVar5,&local_2d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_290,&local_2c0,&local_2e0,0x119,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2c0);
    boost::test_tools::assertion_result::~assertion_result(&local_290);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_248);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_470);
  boost::test_tools::output_test_stream::output_test_stream(local_460,&local_470,1);
  dynamicgraph::command::operator<<((ostream *)local_460,local_50);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_490);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x11f,&local_490);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_4b8,"Type=vector, value=0.5\n1.5");
    boost::test_tools::output_test_stream::is_equal(&local_4a8,local_460,&local_4b8,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,"output.is_equal(\"Type=vector, value=0.5\\n1.5\")",0x2e);
    boost::unit_test::operator<<(&local_4d8,plVar5,&local_4e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_4a8,&local_4d8,&local_4f8,0x11f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d8);
    boost::test_tools::assertion_result::~assertion_result(&local_4a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_460);
  dynamicgraph::command::Value::~Value(local_50);
  dynamicgraph::command::Value::~Value(local_40);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_20);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_vector) {
  using dg::command::Value;

  dg::Vector avector1;
  avector1.resize(2);
  avector1[0] = 0.5;
  avector1[1] = 1.5;
  Value value1(avector1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=vector, value=0.5\n1.5"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=vector, value=0.5\n1.5"));
  }
}